

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtaudio_c.cpp
# Opt level: O0

rtaudio_device_info_t *
rtaudio_get_device_info(rtaudio_device_info_t *__return_storage_ptr__,rtaudio_t audio,uint id)

{
  char *__src;
  size_type sVar1;
  reference pvVar2;
  uint local_80;
  uint j;
  DeviceInfo info;
  uint id_local;
  rtaudio_t audio_local;
  
  info.nativeFormats._4_4_ = id;
  memset(__return_storage_ptr__,0,0x268);
  audio->errtype = 0;
  RtAudio::getDeviceInfo((DeviceInfo *)&j,audio->audio,info.nativeFormats._4_4_);
  if (audio->errtype == 0) {
    __return_storage_ptr__->id = j;
    __return_storage_ptr__->output_channels = info._32_4_;
    __return_storage_ptr__->input_channels = info._36_4_;
    __return_storage_ptr__->duplex_channels = info.outputChannels;
    __return_storage_ptr__->is_default_output = (uint)((byte)info.inputChannels & 1);
    __return_storage_ptr__->is_default_input = (uint)(info.inputChannels._1_1_ & 1);
    __return_storage_ptr__->native_formats = info._80_8_;
    __return_storage_ptr__->preferred_sample_rate =
         info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    __src = (char *)std::__cxx11::string::c_str();
    strncpy(__return_storage_ptr__->name,__src,0x1ff);
    for (local_80 = 0;
        sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &info.duplexChannels), local_80 < sVar1; local_80 = local_80 + 1) {
      if (local_80 < 0x10) {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &info.duplexChannels,(ulong)local_80);
        __return_storage_ptr__->sample_rates[local_80] = *pvVar2;
      }
    }
  }
  RtAudio::DeviceInfo::~DeviceInfo((DeviceInfo *)&j);
  return __return_storage_ptr__;
}

Assistant:

rtaudio_device_info_t rtaudio_get_device_info(rtaudio_t audio, unsigned int id) {
  rtaudio_device_info_t result;
  std::memset(&result, 0, sizeof(result));

  audio->errtype = RTAUDIO_ERROR_NONE;
  RtAudio::DeviceInfo info = audio->audio->getDeviceInfo(id);
  if (audio->errtype != RTAUDIO_ERROR_NONE)
      return result;

  result.id = info.ID;
  result.output_channels = info.outputChannels;
  result.input_channels = info.inputChannels;
  result.duplex_channels = info.duplexChannels;
  result.is_default_output = info.isDefaultOutput;
  result.is_default_input = info.isDefaultInput;
  result.native_formats = info.nativeFormats;
  result.preferred_sample_rate = info.preferredSampleRate;
  strncpy(result.name, info.name.c_str(), sizeof(result.name) - 1);
  for (unsigned int j = 0; j < info.sampleRates.size(); j++) {
    if (j < sizeof(result.sample_rates) / sizeof(result.sample_rates[0])) {
      result.sample_rates[j] = info.sampleRates[j];
    }
  }
  return result;
}